

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

bool __thiscall
pybind11::detail::object_api<pybind11::handle>::rich_compare
          (object_api<pybind11::handle> *this,object_api<pybind11::handle> *other,int value)

{
  int iVar1;
  error_already_set *this_00;
  undefined4 in_register_00000014;
  
  iVar1 = PyObject_RichCompareBool
                    (*(undefined8 *)this,*(undefined8 *)other,CONCAT44(in_register_00000014,value));
  if (iVar1 != -1) {
    return iVar1 == 1;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

PyObject *ptr() const { return m_ptr; }